

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::ExpandStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *new_select_list)

{
  ClientContext *context;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> tVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pVVar3;
  pointer pcVar4;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> _Var5;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> _Var6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  StarExpressionType SVar10;
  int iVar11;
  pointer pPVar12;
  pointer pEVar13;
  type expr_00;
  pointer pattern;
  RE2 *this_00;
  pointer pRVar14;
  type pPVar15;
  ColumnRefExpression *pCVar16;
  string *psVar17;
  type re;
  LogicalType *pLVar18;
  vector<duckdb::Value,_true> *pvVar19;
  duckdb *this_01;
  iterator iVar20;
  BaseExpression *this_02;
  StarExpression *pSVar21;
  reference pvVar22;
  pointer pPVar23;
  ParameterNotResolvedException *this_03;
  BinderException *pBVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ParsedExpression *expr_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *expanded_expr;
  pointer value;
  size_type __n;
  bool bVar26;
  StarExpression *star;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  new_list;
  string err;
  optional_ptr<duckdb::ParsedExpression,_true> child_expr;
  Value val;
  TableFunctionBinder binder;
  StarExpression *local_308;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> local_300;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_2f8;
  string local_2d8;
  undefined1 local_2b8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_2a8;
  undefined1 local_2a0 [8];
  undefined1 local_298 [32];
  float local_278;
  idx_t local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  pointer local_250;
  Binder *local_248;
  pointer local_240;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_238;
  Value local_218;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  string local_1b8;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d8;
  TableFunctionBinder local_b8;
  
  TryTransformStarLike(expr);
  local_308 = (StarExpression *)0x0;
  SVar10 = FindStarExpression(this,expr,&local_308,true,false);
  if (SVar10 == NONE) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)new_select_list,expr);
  }
  else {
    local_2f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a8 = expr;
    local_240 = (pointer)new_select_list;
    BindContext::GenerateAllColumnExpressions
              (&this->bind_context,local_308,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_2f8);
    local_300._M_head_impl = (RE2 *)0x0;
    if ((local_308->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      TableFunctionBinder::TableFunctionBinder(&local_b8,this,this->context,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&local_308->expr);
      (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_258,pPVar12);
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_2a0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_b8,(LogicalType *)&local_258,false);
      pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_2a0);
      iVar11 = (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar13);
      if ((char)iVar11 == '\0') {
        pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(&local_308->expr);
        iVar11 = (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[6])(pPVar12);
        this_03 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        if ((char)iVar11 != '\0') {
          ParameterNotResolvedException::ParameterNotResolvedException(this_03);
          __cxa_throw(this_03,&ParameterNotResolvedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_218.type_._0_8_ = (long)&local_218 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"Unsupported expression in COLUMNS","");
        BinderException::BinderException((BinderException *)this_03,(string *)&local_218);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      context = this->context;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_2a0);
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      ExpressionExecutor::EvaluateScalar(&local_218,context,expr_00,false);
      local_248 = this;
      if ((string)local_218.type_.id_ == (string)0x65) {
        pLVar18 = ListType::GetChildType(&local_218.type_);
        if (pLVar18->id_ != VARCHAR) goto LAB_011a83d4;
        if (local_218.is_null != false) {
LAB_011a8440:
          local_1d8[0] = local_1c8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d8,
                     "Star expression \"%s\" resulted in an empty set of columns","");
          (*(local_308->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[8])
                    (&local_f8);
          StringUtil::Format<std::__cxx11::string>
                    ((string *)local_298,(StringUtil *)local_1d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar25);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
          pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>
                    (pBVar24,&local_308->super_ParsedExpression,(string *)local_298);
          __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar19 = ListValue::GetChildren(&local_218);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pvVar19->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start;
        if (paVar25 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pvVar19->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish) goto LAB_011a8440;
        pvVar19 = ListValue::GetChildren(&local_218);
        local_238.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_298._0_8_ = &aStack_268;
        local_298._8_8_ = &DAT_00000001;
        local_298._16_8_ = (ParsedExpression *)0x0;
        local_298._24_8_ = (DummyBinding *)0x0;
        local_278 = 1.0;
        local_270 = 0;
        aStack_268._M_allocated_capacity = 0;
        value = (pvVar19->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
        pVVar3 = (pvVar19->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (value != pVVar3) {
          paVar25 = &local_2d8.field_2;
          do {
            if (value->is_null == true) {
              pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
              pSVar21 = local_308;
              local_2d8._M_dataplus._M_p = (pointer)paVar25;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2d8,
                         "Columns expression does not support NULL input parameters","");
              BinderException::BinderException<>
                        (pBVar24,&pSVar21->super_ParsedExpression,&local_2d8);
              __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            psVar17 = StringValue::Get_abi_cxx11_(value);
            pcVar4 = (psVar17->_M_dataplus)._M_p;
            local_2d8._M_dataplus._M_p = (pointer)paVar25;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d8,pcVar4,pcVar4 + psVar17->_M_string_length);
            local_2b8 = 0;
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,bool>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_298,&local_2d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != paVar25) {
              operator_delete(local_2d8._M_dataplus._M_p);
            }
            value = value + 1;
          } while (value != pVVar3);
        }
        puVar8 = local_2f8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var5._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             local_298._16_8_;
        if (local_2f8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_2f8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          do {
            this_01 = (duckdb *)
                      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&paVar25->_M_allocated_capacity);
            GetColumnsStringValue_abi_cxx11_(&local_2d8,this_01,expr_01);
            iVar20 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_298,&local_2d8);
            if (iVar20.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                ._M_cur != (__node_type *)0x0) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&local_238,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&paVar25->_M_allocated_capacity);
              *(undefined1 *)
               ((long)iVar20.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                      ._M_cur + 0x28) = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p);
            }
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar25 + 8);
            _Var5._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
                 (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
                 local_298._16_8_;
          } while (paVar25 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)puVar8);
        }
        for (; this = local_248,
            local_2d8.field_2._M_allocated_capacity =
                 (size_type)
                 local_2f8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
            local_2d8._M_string_length =
                 (size_type)
                 local_2f8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
            puVar8 = local_2f8.
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            _Var5._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )0x0; _Var5._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                        (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         )*(__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            *)_Var5._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
            ) {
          if (*(char *)&(((pointer)
                         ((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 0x28))->
                        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
              '\0') {
            pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d8,
                       "Column \"%s\" was selected but was not found in the FROM clause","");
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,
                       *(long *)((long)_Var5._M_t.
                                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                       _M_head_impl + 8),
                       *(long *)((long)_Var5._M_t.
                                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                       _M_head_impl + 0x10) +
                       *(long *)((long)_Var5._M_t.
                                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                       _M_head_impl + 8));
            BinderException::BinderException<std::__cxx11::string>(pBVar24,&local_2d8,&local_118);
            __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        local_2f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_238.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_238.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_238.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2d8._M_dataplus._M_p = (pointer)puVar8;
        local_238.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_2d8);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_298);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector(&local_238);
      }
      else {
        if ((string)local_218.type_.id_ != (string)0x19) {
LAB_011a83d4:
          pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
          pSVar21 = local_308;
          local_298._0_8_ = (long)local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,
                     "COLUMNS expects either a VARCHAR argument (regex) or a LIST of VARCHAR (list of columns)"
                     ,"");
          BinderException::BinderException<>
                    (pBVar24,&pSVar21->super_ParsedExpression,(string *)local_298);
          __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_218.is_null == true) {
          pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
          local_298._0_8_ = (long)local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"COLUMNS does not support NULL as regex argument","");
          BinderException::BinderException(pBVar24,(string *)local_298);
          __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pattern = (pointer)StringValue::Get_abi_cxx11_(&local_218);
        this_00 = (RE2 *)operator_new(0x98);
        duckdb_re2::RE2::RE2(this_00,(string *)pattern);
        _Var6._M_head_impl = local_300._M_head_impl;
        bVar26 = local_300._M_head_impl != (RE2 *)0x0;
        local_300._M_head_impl = this_00;
        if (bVar26) {
          duckdb_re2::RE2::~RE2(_Var6._M_head_impl);
          operator_delete(_Var6._M_head_impl);
        }
        pRVar14 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                  operator->((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                              *)&local_300);
        puVar8 = local_2f8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_250 = pattern;
        if (pRVar14->error_->_M_string_length != 0) {
          local_138[0] = local_128;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"Failed to compile regex \"%s\": %s","");
          pcVar4 = (local_250->name)._M_dataplus._M_p;
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar4,pcVar4 + (local_250->name)._M_string_length);
          pRVar14 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                    operator->((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                                *)&local_300);
          pcVar4 = (pRVar14->error_->_M_dataplus)._M_p;
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,pcVar4,pcVar4 + pRVar14->error_->_M_string_length);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_298,(StringUtil *)local_138,&local_158,&local_178,params_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          if (local_138[0] != local_128) {
            operator_delete(local_138[0]);
          }
          pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>
                    (pBVar24,&local_308->super_ParsedExpression,(string *)local_298);
          __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_2d8._M_dataplus._M_p = (pointer)0x0;
        local_2d8._M_string_length = 0;
        local_2d8.field_2._M_allocated_capacity = 0;
        if (local_2f8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_2f8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_011a84fc:
          local_198[0] = local_188;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"No matching columns found that match regex \"%s\"","");
          pcVar4 = (local_250->name)._M_dataplus._M_p;
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,pcVar4,pcVar4 + (local_250->name)._M_string_length);
          StringUtil::Format<std::__cxx11::string>
                    ((string *)local_298,(StringUtil *)local_198,&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar25);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          if (local_198[0] != local_188) {
            operator_delete(local_198[0]);
          }
          pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>
                    (pBVar24,&local_308->super_ParsedExpression,(string *)local_298);
          __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8.
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&paVar25->_M_allocated_capacity);
          local_238.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)GetResolvedColumnExpression(pPVar15);
          if ((ParsedExpression *)
              local_238.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (ParsedExpression *)0x0) {
            optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
                      ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_238);
            pCVar16 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                                ((BaseExpression *)
                                 local_238.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
            psVar17 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar16);
            tVar1.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  )(psVar17->_M_dataplus)._M_p;
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)psVar17->_M_string_length;
            re = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator*
                           ((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                             *)&local_300);
            local_298._0_8_ =
                 tVar1.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            local_298._8_8_ = paVar2;
            bVar26 = duckdb_re2::RE2::PartialMatchN((StringPiece *)local_298,re,(Arg **)0x0,0);
            if (bVar26) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&local_2d8,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&paVar25->_M_allocated_capacity);
            }
          }
          local_298._16_8_ =
               local_2f8.
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar9 = local_2f8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar7 = local_2f8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar25 + 8);
        } while (paVar25 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)puVar8);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_string_length;
        if (local_2d8._M_dataplus._M_p == (pointer)local_2d8._M_string_length) goto LAB_011a84fc;
        local_2f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_2d8.field_2._M_allocated_capacity;
        local_2f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._M_dataplus._M_p;
        local_2f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._M_string_length;
        local_298._0_8_ = puVar7;
        local_298._8_8_ = puVar9;
        local_2d8._M_dataplus._M_p = (pointer)0x0;
        local_2d8._M_string_length = 0;
        local_2d8.field_2._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_298);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_2d8);
        this = local_248;
      }
      Value::~Value(&local_218);
      if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_2a0 !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (**(code **)(*(_func_int **)local_2a0 + 8))();
      }
      if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(local_258._M_pi)->_vptr__Sp_counted_base[1])();
      }
      local_b8.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)&PTR__TableFunctionBinder_0244ceb0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.table_function_name._M_dataplus._M_p != &local_b8.table_function_name.field_2)
      {
        operator_delete(local_b8.table_function_name._M_dataplus._M_p);
      }
      ExpressionBinder::~ExpressionBinder(&local_b8.super_ExpressionBinder);
    }
    (*(local_308->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              (&local_218);
    this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&local_218)->super_BaseExpression;
    pSVar21 = BaseExpression::Cast<duckdb::StarExpression>(this_02);
    if (SVar10 == UNPACKED) {
      pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(local_2a8);
      bVar26 = StarExpression::IsColumnsUnpacked(pPVar15);
      if (bVar26) {
        pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
        local_b8.super_ExpressionBinder._vptr_ExpressionBinder =
             (_func_int **)&local_b8.super_ExpressionBinder.target_type.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"*COLUMNS not allowed at the root level, use COLUMNS instead"
                   ,"");
        BinderException::BinderException(pBVar24,(string *)&local_b8);
        __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ReplaceUnpackedStarExpression
                (this,local_2a8,(expression_list_t *)&local_2f8,pSVar21,
                 (optional_ptr<duckdb_re2::RE2,_true>)local_300._M_head_impl);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)local_240,local_2a8);
    }
    else if (local_2f8.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_2f8.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(local_2a8);
        (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[0xc])
                  ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_298,pPVar12);
        pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_2f8,__n);
        ReplaceStarExpression
                  ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_298,pvVar22);
        bVar26 = StarExpression::IsColumns(&pSVar21->super_ParsedExpression);
        if (bVar26) {
          pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)&local_2f8,__n);
          pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(pvVar22);
          local_2d8._M_dataplus._M_p = (pointer)GetResolvedColumnExpression(pPVar15);
          if ((ParsedExpression *)local_2d8._M_dataplus._M_p != (ParsedExpression *)0x0) {
            optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
                      ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_2d8);
            pCVar16 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                                ((BaseExpression *)local_2d8._M_dataplus._M_p);
            pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)local_298);
            if ((pPVar12->super_BaseExpression).alias._M_string_length == 0) {
              pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_298);
              ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar16);
              ::std::__cxx11::string::_M_assign((string *)&(pPVar12->super_BaseExpression).alias);
            }
            else {
              pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_298);
              pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_298);
              psVar17 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar16);
              ReplaceColumnsAlias((string *)&local_b8,&(pPVar23->super_BaseExpression).alias,psVar17
                                  ,(optional_ptr<duckdb_re2::RE2,_true>)local_300._M_head_impl);
              ::std::__cxx11::string::operator=
                        ((string *)&(pPVar12->super_BaseExpression).alias,(string *)&local_b8);
              if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                  local_b8.super_ExpressionBinder._vptr_ExpressionBinder !=
                  &local_b8.super_ExpressionBinder.target_type.type_info_) {
                operator_delete(local_b8.super_ExpressionBinder._vptr_ExpressionBinder);
              }
            }
          }
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_240,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_298);
        if ((ParsedExpression *)local_298._0_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(size_type *)local_298._0_8_ + 8))();
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)local_2f8.
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2f8.
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
        local_218.type_._0_8_ !=
        (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
        0x0) {
      (**(code **)&(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_218.type_._0_8_)->
                   _M_use_count)();
    }
    _Var6._M_head_impl = local_300._M_head_impl;
    if (local_300._M_head_impl != (RE2 *)0x0) {
      duckdb_re2::RE2::~RE2(local_300._M_head_impl);
      operator_delete(_Var6._M_head_impl);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_2f8);
  }
  return;
}

Assistant:

void Binder::ExpandStarExpression(unique_ptr<ParsedExpression> expr,
                                  vector<unique_ptr<ParsedExpression>> &new_select_list) {
	TryTransformStarLike(expr);

	StarExpression *star = nullptr;

	//! Check the current 'expr' to find out if it contains a star-expression
	//! that needs to be expanded
	auto star_type = FindStarExpression(expr, &star, true, false);
	if (star_type == StarExpressionType::NONE) {
		// no star expression: add it as-is
		D_ASSERT(!star);
		new_select_list.push_back(std::move(expr));
		return;
	}
	D_ASSERT(star);
	vector<unique_ptr<ParsedExpression>> star_list;
	//! Expand the star that we found into a new list of expressions
	bind_context.GenerateAllColumnExpressions(*star, star_list);

	unique_ptr<duckdb_re2::RE2> regex;
	if (star->expr) {
		// COLUMNS with an expression
		// two options:
		// VARCHAR parameter <- this is a regular expression
		// LIST of VARCHAR parameters <- this is a set of columns
		TableFunctionBinder binder(*this, context);
		auto child = star->expr->Copy();
		auto result = binder.Bind(child);
		if (!result->IsFoldable()) {
			// cannot resolve parameters here
			if (star->expr->HasParameter()) {
				throw ParameterNotResolvedException();
			} else {
				throw BinderException("Unsupported expression in COLUMNS");
			}
		}
		auto val = ExpressionExecutor::EvaluateScalar(context, *result);
		if (val.type().id() == LogicalTypeId::VARCHAR) {
			// regex
			if (val.IsNull()) {
				throw BinderException("COLUMNS does not support NULL as regex argument");
			}
			auto &regex_str = StringValue::Get(val);
			regex = make_uniq<duckdb_re2::RE2>(regex_str);
			if (!regex->error().empty()) {
				auto err = StringUtil::Format("Failed to compile regex \"%s\": %s", regex_str, regex->error());
				throw BinderException(*star, err);
			}
			vector<unique_ptr<ParsedExpression>> new_list;
			for (auto &expanded_expr : star_list) {
				auto child_expr = GetResolvedColumnExpression(*expanded_expr);
				if (!child_expr) {
					continue;
				}
				auto &colref = child_expr->Cast<ColumnRefExpression>();
				if (!RE2::PartialMatch(colref.GetColumnName(), *regex)) {
					continue;
				}
				new_list.push_back(std::move(expanded_expr));
			}
			if (new_list.empty()) {
				auto err = StringUtil::Format("No matching columns found that match regex \"%s\"", regex_str);
				throw BinderException(*star, err);
			}
			star_list = std::move(new_list);
		} else if (val.type().id() == LogicalTypeId::LIST &&
		           ListType::GetChildType(val.type()).id() == LogicalTypeId::VARCHAR) {
			// list of varchar columns
			if (val.IsNull() || ListValue::GetChildren(val).empty()) {
				auto err =
				    StringUtil::Format("Star expression \"%s\" resulted in an empty set of columns", star->ToString());
				throw BinderException(*star, err);
			}
			auto &children = ListValue::GetChildren(val);
			vector<unique_ptr<ParsedExpression>> new_list;
			// scan the list for all selected columns and construct a lookup table
			case_insensitive_map_t<bool> selected_set;
			for (auto &child : children) {
				if (child.IsNull()) {
					throw BinderException(*star, "Columns expression does not support NULL input parameters");
				}
				selected_set.insert(make_pair(StringValue::Get(child), false));
			}
			// now check the list of all possible expressions and select which ones make it in
			for (auto &expr : star_list) {
				auto str = GetColumnsStringValue(*expr);
				auto entry = selected_set.find(str);
				if (entry != selected_set.end()) {
					new_list.push_back(std::move(expr));
					entry->second = true;
				}
			}
			// check if all expressions found a match
			for (auto &entry : selected_set) {
				if (!entry.second) {
					throw BinderException("Column \"%s\" was selected but was not found in the FROM clause",
					                      entry.first);
				}
			}
			star_list = std::move(new_list);
		} else {
			throw BinderException(
			    *star, "COLUMNS expects either a VARCHAR argument (regex) or a LIST of VARCHAR (list of columns)");
		}
	}
	//! We make a copy because we will be replacing the original star
	//! If we have identical stars that also need to be replaced
	//! This causes a heap-use-after-free or other corruption if we don't make a copy to reference instead.
	auto copied_star_p = star->Copy();
	auto &copied_star = copied_star_p->Cast<StarExpression>();

	// now perform the replacement
	if (star_type == StarExpressionType::UNPACKED) {
		if (StarExpression::IsColumnsUnpacked(*expr)) {
			throw BinderException("*COLUMNS not allowed at the root level, use COLUMNS instead");
		}
		ReplaceUnpackedStarExpression(expr, star_list, copied_star, regex.get());
		new_select_list.push_back(std::move(expr));
		return;
	}
	for (idx_t i = 0; i < star_list.size(); i++) {
		auto new_expr = expr->Copy();
		ReplaceStarExpression(new_expr, star_list[i]);
		if (StarExpression::IsColumns(copied_star)) {
			auto expr = GetResolvedColumnExpression(*star_list[i]);
			if (expr) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (new_expr->GetAlias().empty()) {
					new_expr->SetAlias(colref.GetColumnName());
				} else {
					new_expr->SetAlias(ReplaceColumnsAlias(new_expr->GetAlias(), colref.GetColumnName(), regex.get()));
				}
			}
		}
		new_select_list.push_back(std::move(new_expr));
	}
}